

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O1

int main(void)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  UserData webdata;
  N_Vector p_Var6;
  sunrealtype **ppsVar7;
  N_Vector cp;
  N_Vector id;
  long lVar8;
  long lVar9;
  char *pcVar10;
  sunindextype ml;
  void *mu;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  sunrealtype atol;
  void *mem;
  SUNContext ctx;
  sunrealtype tret;
  void *local_68;
  undefined8 local_60;
  long local_58;
  N_Vector local_50;
  long local_48;
  double local_40;
  sunrealtype local_38;
  
  local_68 = (void *)0x0;
  uVar4 = SUNContext_Create(0,&local_60);
  if ((int)uVar4 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    webdata = (UserData)malloc(0x78);
    p_Var6 = (N_Vector)N_VNew_Serial(800,local_60);
    webdata->rates = p_Var6;
    ppsVar7 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
    webdata->acoef = ppsVar7;
    webdata->mx = 0x14;
    webdata->my = 0x14;
    webdata->ns = 2;
    webdata->np = 1;
    webdata->dx = 0.05263157894736842;
    webdata->dy = 0.05263157894736842;
    webdata->Neq = 800;
    psVar1 = *ppsVar7;
    psVar2 = ppsVar7[1];
    psVar1[1] = -5e-07;
    *psVar2 = 10000.0;
    *psVar1 = 0.0;
    psVar2[1] = 0.0;
    *psVar1 = -1.0;
    psVar2[1] = -1.0;
    webdata->bcoef[0] = 1.0;
    webdata->bcoef[1] = -1.0;
    *(undefined4 *)webdata->cox = 1;
    *(undefined4 *)((long)webdata->cox + 4) = 0x40769000;
    *(undefined4 *)(webdata->cox + 1) = 0xccccccce;
    *(undefined4 *)((long)webdata->cox + 0xc) = 0x40320ccc;
    *(undefined4 *)webdata->coy = 1;
    *(undefined4 *)((long)webdata->coy + 4) = 0x40769000;
    *(undefined4 *)(webdata->coy + 1) = 0xccccccce;
    *(undefined4 *)((long)webdata->coy + 0xc) = 0x40320ccc;
    p_Var6 = (N_Vector)N_VNew_Serial(800,local_60);
    if (p_Var6 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    cp = (N_Vector)N_VClone(p_Var6);
    if (cp == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    id = (N_Vector)N_VClone(p_Var6);
    if (id == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    SetInitialProfiles(p_Var6,cp,id,webdata);
    local_68 = (void *)IDACreate(local_60);
    if (local_68 == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar4 = IDASetUserData(local_68,webdata);
    if ((int)uVar4 < 0) {
      pcVar10 = "IDASetUserData";
    }
    else {
      uVar4 = IDASetId(local_68,id);
      if ((int)uVar4 < 0) {
        pcVar10 = "IDASetId";
      }
      else {
        uVar4 = IDAInit(0,local_68,resweb,p_Var6,cp);
        if ((int)uVar4 < 0) {
          pcVar10 = "IDAInit";
        }
        else {
          atol = 1e-05;
          uVar4 = IDASStolerances(local_68);
          if ((int)uVar4 < 0) {
            pcVar10 = "IDASStolerances";
          }
          else {
            lVar8 = SUNBandMatrix(800,0x28,0x28,local_60);
            if (lVar8 == 0) {
              main_cold_2();
              return 1;
            }
            lVar9 = SUNLinSol_Band(p_Var6,lVar8,local_60);
            if (lVar9 == 0) {
              main_cold_1();
              return 1;
            }
            uVar4 = IDASetLinearSolver(local_68,lVar9,lVar8);
            if (-1 < (int)uVar4) {
              uVar5 = 1;
              ml = 1;
              mu = local_68;
              local_48 = lVar9;
              uVar4 = IDACalcIC(0xd2f1a9fc);
              if ((int)uVar4 < 0) {
                pcVar10 = "IDACalcIC";
              }
              else {
                local_58 = lVar8;
                local_50 = id;
                PrintHeader((sunindextype)mu,ml,
                            (sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),atol);
                PrintOutput(local_68,p_Var6,0.0);
                uVar4 = 1;
                dVar3 = 0.001;
                while (local_40 = dVar3, uVar5 = IDASolve(local_68,&local_38,p_Var6,cp,1),
                      -1 < (int)uVar5) {
                  PrintOutput(local_68,p_Var6,local_38);
                  dVar3 = local_40 * 10.0;
                  if (2 < uVar4) {
                    dVar3 = local_40 + 0.3;
                  }
                  uVar4 = uVar4 + 1;
                  if (uVar4 == 7) {
                    PrintFinalStats(local_68);
                    IDAFree(&local_68);
                    SUNLinSolFree(local_48);
                    SUNMatDestroy(local_58);
                    N_VDestroy(p_Var6);
                    N_VDestroy(cp);
                    N_VDestroy(local_50);
                    SUNDlsMat_destroyMat(webdata->acoef);
                    N_VDestroy(webdata->rates);
                    free(webdata);
                    SUNContext_Free(&local_60);
                    return 0;
                  }
                }
                pcVar10 = "IDASolve";
                uVar4 = uVar5;
              }
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,
                      (ulong)uVar4);
              return uVar5;
            }
            pcVar10 = "IDASetLinearSolver";
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  UserData webdata;
  N_Vector cc, cp, id;
  int iout, retval;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem     = NULL;
  webdata = NULL;
  cc = cp = id = NULL;
  A            = NULL;
  LS           = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate and initialize user data block webdata. */

  webdata        = (UserData)malloc(sizeof *webdata);
  webdata->rates = N_VNew_Serial(NEQ, ctx);
  webdata->acoef = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);

  InitUserData(webdata);

  /* Allocate N-vectors and initialize cc, cp, and id. */

  cc = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)cc, "N_VNew_Serial", 0)) { return (1); }

  cp = N_VClone(cc);
  if (check_retval((void*)cp, "N_VNew_Serial", 0)) { return (1); }

  id = N_VClone(cc);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  SetInitialProfiles(cc, cp, id, webdata);

  /* Set remaining inputs to IDAMalloc. */

  t0   = ZERO;
  rtol = RTOL;
  atol = ATOL;

  /* Call IDACreate and IDAMalloc to initialize IDA. */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, webdata);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDAInit(mem, resweb, t0, cc, cp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = ml = NSMX;
  A       = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(cc, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC (with default options) to correct the initial values. */

  tout   = SUN_RCONST(0.001);
  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, tout);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print heading, basic parameters, and initial values. */

  PrintHeader(mu, ml, rtol, atol);
  PrintOutput(mem, cc, ZERO);

  /* Loop over iout, call IDASolve (normal mode), print selected output. */

  for (iout = 1; iout <= NOUT; iout++)
  {
    retval = IDASolve(mem, tout, &tret, cc, cp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (retval); }

    PrintOutput(mem, cc, tret);

    if (iout < 3) { tout *= TMULT; }
    else { tout += TADD; }
  }

  /* Print final statistics and free memory. */

  PrintFinalStats(mem);

  /* Free memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(cc);
  N_VDestroy(cp);
  N_VDestroy(id);

  SUNDlsMat_destroyMat(webdata->acoef);
  N_VDestroy(webdata->rates);
  free(webdata);

  SUNContext_Free(&ctx);

  return (0);
}